

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTryDelegate(CWriter *this,TryExpr *tryexpr)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  string local_c0;
  LabelDecl local_a0;
  Newline local_7d;
  CloseBrace local_7c;
  Newline local_7b;
  CloseBrace local_7a;
  Newline local_79;
  undefined1 local_78 [8];
  string label_target;
  string *unwind_name_1;
  LabelName local_40;
  Label *local_38;
  Label *label;
  reference local_28;
  string *unwind_name;
  size_t mark;
  TryExpr *tryexpr_local;
  CWriter *this_local;
  
  mark = (size_t)tryexpr;
  tryexpr_local = (TryExpr *)this;
  unwind_name = (string *)BeginTry(this,&tryexpr->block);
  bVar1 = Var::is_index((Var *)(mark + 0x130));
  if (bVar1) {
    bVar1 = std::
            vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
            ::empty(&this->try_catch_stack_);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!try_catch_stack_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xd81,
                    "void wabt::(anonymous namespace)::CWriter::WriteTryDelegate(const TryExpr &)");
    }
    local_28 = std::
               vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ::at(&this->try_catch_stack_,0);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [27])"wasm_rt_set_unwind_target(",&local_28->name,
               (char (*) [16])"_outer_target);",(Newline *)((long)&label + 7));
    (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [17])"wasm_rt_throw();",(Newline *)((long)&label + 6));
  }
  else {
    local_38 = FindLabel(this,(Var *)(mark + 0x130),false);
    sVar3 = std::
            vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
            ::size(&this->try_catch_stack_);
    if (sVar3 < local_38->try_catch_stack_size) {
      __assert_fail("try_catch_stack_.size() >= label->try_catch_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xd8a,
                    "void wabt::(anonymous namespace)::CWriter::WriteTryDelegate(const TryExpr &)");
    }
    if (local_38->label_type == Try) {
      LabelName::LocalName(&local_40,local_38->name);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[8],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [6])"goto ",&local_40,(char (*) [8])"_catch;",
                 (Newline *)((long)&unwind_name_1 + 7));
      pvVar4 = std::
               vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ::at(&this->try_catch_stack_,local_38->try_catch_stack_size);
      pvVar4->used = true;
    }
    else if (local_38->try_catch_stack_size == 0) {
      bVar1 = std::
              vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
              ::empty(&this->try_catch_stack_);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!try_catch_stack_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                      ,0xd90,
                      "void wabt::(anonymous namespace)::CWriter::WriteTryDelegate(const TryExpr &)"
                     );
      }
      pvVar4 = std::
               vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ::at(&this->try_catch_stack_,0);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [27])"wasm_rt_set_unwind_target(",&pvVar4->name,
                 (char (*) [16])"_outer_target);",
                 (Newline *)(label_target.field_2._M_local_buf + 0xf));
      (anonymous_namespace)::CWriter::Write<char_const(&)[17],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [17])"wasm_rt_throw();",
                 (Newline *)(label_target.field_2._M_local_buf + 0xe));
    }
    else {
      pvVar4 = std::
               vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ::at(&this->try_catch_stack_,local_38->try_catch_stack_size - 1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     &pvVar4->name,"_catch");
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [6])"goto ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (char (*) [2])0x238bef,&local_79);
      pvVar4 = std::
               vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
               ::at(&this->try_catch_stack_,local_38->try_catch_stack_size - 1);
      pvVar4->used = true;
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_7a,&local_7b);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_7c,&local_7d);
  PopTryCatch(this);
  ResetTypeStack(this,(size_t)unwind_name);
  bVar1 = std::
          vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
          ::empty(&this->label_stack_);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::
             vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ::back(&this->label_stack_);
    _Var2 = std::operator==(pvVar5->name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (mark + 0x40));
    if (_Var2) {
      GetLocalName(&local_c0,this,(string *)(mark + 0x40),true);
      LabelDecl::LabelDecl(&local_a0,&local_c0);
      Write(this,&local_a0);
      LabelDecl::~LabelDecl(&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      PopLabel(this);
      PushTypes(this,(TypeVector *)(mark + 200));
      return;
    }
    __assert_fail("label_stack_.back().name == tryexpr.block.label",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xda4,
                  "void wabt::(anonymous namespace)::CWriter::WriteTryDelegate(const TryExpr &)");
  }
  __assert_fail("!label_stack_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0xda3,
                "void wabt::(anonymous namespace)::CWriter::WriteTryDelegate(const TryExpr &)");
}

Assistant:

void CWriter::WriteTryDelegate(const TryExpr& tryexpr) {
  const size_t mark = BeginTry(tryexpr.block);

  /* exception has been thrown -- where do we delegate it? */

  if (tryexpr.delegate_target.is_index()) {
    /* must be the implicit function label */
    assert(!try_catch_stack_.empty());
    const std::string& unwind_name = try_catch_stack_.at(0).name;
    Write("wasm_rt_set_unwind_target(", unwind_name, "_outer_target);",
          Newline());

    Write("wasm_rt_throw();", Newline());
  } else {
    const Label* label = FindLabel(tryexpr.delegate_target, false);

    assert(try_catch_stack_.size() >= label->try_catch_stack_size);

    if (label->label_type == LabelType::Try) {
      Write("goto ", LabelName(label->name), "_catch;", Newline());
      try_catch_stack_.at(label->try_catch_stack_size).used = true;
    } else if (label->try_catch_stack_size == 0) {
      assert(!try_catch_stack_.empty());
      const std::string& unwind_name = try_catch_stack_.at(0).name;
      Write("wasm_rt_set_unwind_target(", unwind_name, "_outer_target);",
            Newline());

      Write("wasm_rt_throw();", Newline());
    } else {
      const std::string label_target =
          try_catch_stack_.at(label->try_catch_stack_size - 1).name + "_catch";
      Write("goto ", label_target, ";", Newline());
      try_catch_stack_.at(label->try_catch_stack_size - 1).used = true;
    }
  }

  Write(CloseBrace(), Newline());
  Write(CloseBrace(), Newline());

  PopTryCatch();
  ResetTypeStack(mark);
  assert(!label_stack_.empty());
  assert(label_stack_.back().name == tryexpr.block.label);
  Write(LabelDecl(GetLocalName(tryexpr.block.label, true)));
  PopLabel();
  PushTypes(tryexpr.block.decl.sig.result_types);
}